

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O3

void info_print_choice(lyout *out,lys_node *node,int *UNUSED_first)

{
  ly_print(out,"%-*s%s\n",0xb,"Choice: ",node->name);
  ly_print(out,"%-*s%s\n",0xb,"Module: ",node->module->name);
  info_print_text(out,node->dsc,"Desc: ");
  info_print_text(out,node->ref,"Reference: ");
  info_print_flags(out,node->flags,0xfb,0);
  ly_print(out,"%-*s",0xb,"Default: ");
  if (node[1].name == (char *)0x0) {
    ly_print(out,"\n");
  }
  else {
    ly_print(out,"%s\n",*(undefined8 *)node[1].name);
  }
  info_print_if_feature(out,node->module,node->iffeature,node->iffeature_size);
  info_print_when(out,*(lys_when **)node->hash);
  info_print_snode(out,node,node->child,"Cases:");
  return;
}

Assistant:

static void
info_print_choice(struct lyout *out, const struct lys_node *node, int *UNUSED(first))
{
    struct lys_node_choice *choice = (struct lys_node_choice *)node;

    ly_print(out, "%-*s%s\n", INDENT_LEN, "Choice: ", choice->name);
    ly_print(out, "%-*s%s\n", INDENT_LEN, "Module: ", choice->module->name);
    info_print_text(out, choice->dsc, "Desc: ");
    info_print_text(out, choice->ref, "Reference: ");
    info_print_flags(out, choice->flags, LYS_CONFIG_MASK | LYS_STATUS_MASK | LYS_MAND_MASK, 0);
    ly_print(out, "%-*s", INDENT_LEN, "Default: ");
    if (choice->dflt) {
        ly_print(out, "%s\n", choice->dflt->name);
    } else {
        ly_print(out, "\n");
    }
    info_print_if_feature(out, choice->module, choice->iffeature, choice->iffeature_size);
    info_print_when(out, choice->when);

    info_print_snode(out, (struct lys_node *)choice, choice->child, "Cases:");
}